

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParserFindNodeInfoIndex(void)

{
  int iVar1;
  int iVar2;
  xmlParserNodeInfoSeqPtr val;
  xmlNodePtr val_00;
  unsigned_long val_01;
  int local_34;
  int n_node;
  xmlNodePtr node;
  int n_seq;
  xmlParserNodeInfoSeqPtr seq;
  unsigned_long ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (node._4_4_ = 0; (int)node._4_4_ < 1; node._4_4_ = node._4_4_ + 1) {
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlParserNodeInfoSeqPtr(node._4_4_,0);
      val_00 = gen_xmlNodePtr(local_34,1);
      val_01 = xmlParserFindNodeInfoIndex(val,val_00);
      desret_unsigned_long(val_01);
      call_tests = call_tests + 1;
      des_xmlParserNodeInfoSeqPtr(node._4_4_,val,0);
      des_xmlNodePtr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserFindNodeInfoIndex",(ulong)(uint)(iVar2 - iVar1))
        ;
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)node._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlParserFindNodeInfoIndex(void) {
    int test_ret = 0;

    int mem_base;
    unsigned long ret_val;
    xmlParserNodeInfoSeqPtr seq; /* a node info sequence pointer */
    int n_seq;
    xmlNodePtr node; /* an XML node pointer */
    int n_node;

    for (n_seq = 0;n_seq < gen_nb_xmlParserNodeInfoSeqPtr;n_seq++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
        mem_base = xmlMemBlocks();
        seq = gen_xmlParserNodeInfoSeqPtr(n_seq, 0);
        node = gen_xmlNodePtr(n_node, 1);

        ret_val = xmlParserFindNodeInfoIndex(seq, node);
        desret_unsigned_long(ret_val);
        call_tests++;
        des_xmlParserNodeInfoSeqPtr(n_seq, seq, 0);
        des_xmlNodePtr(n_node, node, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParserFindNodeInfoIndex",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_seq);
            printf(" %d", n_node);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}